

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void sendHelpToSlack(string *CHANNEL_NAME)

{
  allocator local_111;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)CHANNEL_NAME);
  std::__cxx11::string::string((string *)&local_b0,"Here are a list of valid commands",&local_111);
  sendMessageToSlack(&local_30,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50,(string *)CHANNEL_NAME);
  std::__cxx11::string::string
            ((string *)&local_d0,"`@kubernetesbot get nodes` show\'s information about nodes",
             &local_111);
  sendMessageToSlack(&local_50,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)CHANNEL_NAME);
  std::__cxx11::string::string
            ((string *)&local_f0,"`@kubernetesbot get pods`   shows information about pods",
             &local_111);
  sendMessageToSlack(&local_70,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,(string *)CHANNEL_NAME);
  std::__cxx11::string::string
            ((string *)&local_110,"`@kubernetesbot help`   displays valid commands",&local_111);
  sendMessageToSlack(&local_90,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void sendHelpToSlack(string CHANNEL_NAME) {
    sendMessageToSlack(CHANNEL_NAME, "Here are a list of valid commands");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot get nodes` show's information about nodes");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot get pods`   shows information about pods");
    sendMessageToSlack(CHANNEL_NAME, "`@kubernetesbot help`   displays valid commands");
}